

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O3

Float __thiscall pbrt::MIPMap::Bilerp<float>(MIPMap *this,int level,Point2f st)

{
  Image *this_00;
  WrapMode WVar1;
  Image *pIVar2;
  ulong uVar3;
  WrapMode2D wrapMode;
  size_t sVar4;
  WrapMode2D wrapMode_00;
  int c;
  float fVar5;
  Float FVar6;
  undefined1 local_38 [40];
  size_t local_10;
  
  if ((level < 0) || (uVar3 = (ulong)(uint)level, (this->pyramid).nStored <= uVar3)) {
    LogFatal<char_const(&)[37]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/mipmap.cpp"
               ,0x188,"Check failed: %s",(char (*) [37])"level >= 0 && level < pyramid.size()");
  }
  pIVar2 = (this->pyramid).ptr;
  this_00 = pIVar2 + uVar3;
  local_38._0_4_ = (undefined4)pIVar2[uVar3].channelNames.nStored;
  if (local_38._0_4_ == 4) {
    WVar1 = this->wrapMode;
    c = 3;
  }
  else {
    if (local_38._0_4_ == 3) {
      wrapMode.wrap.values[1] = this->wrapMode;
      wrapMode.wrap.values[0] = this->wrapMode;
      Image::Bilerp((ImageChannelValues *)local_38,this_00,st,wrapMode);
      if (local_10 == 0) {
        fVar5 = 0.0;
      }
      else {
        fVar5 = 0.0;
        if ((float *)local_38._8_8_ == (float *)0x0) {
          local_38._8_8_ = local_38 + 0x10;
        }
        sVar4 = 0;
        do {
          fVar5 = fVar5 + *(float *)(local_38._8_8_ + sVar4 * 4);
          sVar4 = sVar4 + 1;
        } while (local_10 != sVar4);
      }
      InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)local_38);
      return fVar5 / (float)(long)local_10;
    }
    if (local_38._0_4_ != 1) {
      LogFatal<int>(Fatal,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/mipmap.cpp"
                    ,0x192,"Unexpected number of image channels: %d",(int *)local_38);
    }
    WVar1 = this->wrapMode;
    c = 0;
  }
  wrapMode_00.wrap.values[1] = WVar1;
  wrapMode_00.wrap.values[0] = WVar1;
  FVar6 = Image::BilerpChannel(this_00,st,c,wrapMode_00);
  return FVar6;
}

Assistant:

Float MIPMap::Bilerp(int level, Point2f st) const {
    CHECK(level >= 0 && level < pyramid.size());
    switch (pyramid[level].NChannels()) {
    case 1:
        return pyramid[level].BilerpChannel(st, 0, wrapMode);
    case 3:
        return pyramid[level].Bilerp(st, wrapMode).Average();
    case 4:
        // Return alpha
        return pyramid[level].BilerpChannel(st, 3, wrapMode);
    default:
        LOG_FATAL("Unexpected number of image channels: %d", pyramid[level].NChannels());
    }
}